

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

void ExtractPublicDependencies
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *components)

{
  __node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  Component *comp;
  _Hash_node_base *local_30;
  
  p_Var1 = &(components->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    local_30 = p_Var1[5]._M_nxt;
    p_Var2 = local_30 + 0x33;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      if (*(char *)&p_Var2[1]._M_nxt[0x1b]._M_nxt == '\x01') {
        p_Var3 = p_Var2[1]._M_nxt + 0xc;
        while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          std::
          _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(local_30 + 0xf),p_Var3[1]._M_nxt + 0x18);
          std::__detail::
          _Insert_base<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_30 + 8),(value_type *)(p_Var3[1]._M_nxt + 0x18));
        }
      }
    }
    std::
    _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(local_30 + 8),&local_30);
    std::
    _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(local_30 + 0xf),&local_30);
  }
  return;
}

Assistant:

void ExtractPublicDependencies(std::unordered_map<std::string, Component *> &components) {
    for (auto &c : components) {
        Component *comp = c.second;
        for (auto &fp : comp->files) {
            if (fp->hasExternalInclude) {
                for (auto &dep : fp->dependencies) {
                    comp->privDeps.erase(dep->component);
                    comp->pubDeps.insert(dep->component);
                }
            }
        }
        comp->pubDeps.erase(comp);
        comp->privDeps.erase(comp);
    }
}